

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# knucleotide.cc
# Opt level: O1

void Calculate<1ul>(Data *input,size_t begin,HashTable<1UL> *table)

{
  byte *pbVar1;
  byte *pbVar2;
  Key<1UL> local_44;
  pair<phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<Key<1UL>,_unsigned_int>,_Key<1UL>::Hash,_phmap::EqualTo<Key<1UL>_>,_std::allocator<std::pair<const_Key<1UL>,_unsigned_int>_>_>::iterator,_bool>
  local_40;
  
  local_44._data =
       (Data)(input->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start[begin];
  phmap::priv::
  raw_hash_map<phmap::priv::FlatHashMapPolicy<Key<1ul>,unsigned_int>,Key<1ul>::Hash,phmap::EqualTo<Key<1ul>>,std::allocator<std::pair<Key<1ul>const,unsigned_int>>>
  ::try_emplace_impl<Key<1ul>const&>(&local_40,table,&local_44);
  *(int *)((long)local_40.first.field_1.slot_ + 4) =
       *(int *)((long)local_40.first.field_1.slot_ + 4) + 1;
  pbVar1 = (input->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  pbVar2 = (input->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start + begin + 4;
  if (pbVar2 < pbVar1) {
    do {
      local_44._data = *pbVar2 & 3;
      phmap::priv::
      raw_hash_map<phmap::priv::FlatHashMapPolicy<Key<1ul>,unsigned_int>,Key<1ul>::Hash,phmap::EqualTo<Key<1ul>>,std::allocator<std::pair<Key<1ul>const,unsigned_int>>>
      ::try_emplace_impl<Key<1ul>const&>(&local_40,table,&local_44);
      *(int *)((long)local_40.first.field_1.slot_ + 4) =
           *(int *)((long)local_40.first.field_1.slot_ + 4) + 1;
      pbVar2 = pbVar2 + 4;
    } while (pbVar2 < pbVar1);
  }
  return;
}

Assistant:

void Calculate(const Cfg::Data& input, size_t begin, HashTable<size>& table)
{
    // original implementation fully recomputes the hash key for each
    // insert to the hash table. This implementation only partially
    // updates the hash, this is the same with C GCC, Rust #6 and Rust #4
    Key<size> key;
    // initialize key
    key.InitKey(input.data() + begin);
    // use key to increment value
    ++table[key];

    auto itr_begin = input.data() + begin + thread_count;
    auto itr_end = (input.data() + input.size() + 1) - size;
    size_t nsize = std::min(size, thread_count);
    for(;itr_begin < itr_end; itr_begin += thread_count) {
        // update the key 1 byte at a time
        for(unsigned i = 0; i < nsize; ++i)
            key.UpdateKey( itr_begin[i] );

        // then finally mask out excess information
        key.MaskKey();

        // then use key to increment value
        ++table[key];
    }
}